

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

int parse_expr(lword current_addr,lword *result)

{
  lword lVar1;
  int iVar2;
  Expr *tree;
  
  lVar1 = caddr;
  caddr = current_addr;
  skip();
  tree = expression();
  if (caddr == -2) {
    iVar2 = 1;
  }
  else {
    iVar2 = eval_expr(tree,result);
  }
  free_expr(tree);
  caddr = lVar1;
  return iVar2;
}

Assistant:

int parse_expr(lword current_addr,lword *result)
/* Tries to parse the input stream. Returns !0 for an absolute result.
   If current_addr = -1 then '.' is not defined and only references
   to absolute symbols are allowed.
   If current_addr = -2 then no expression evaluation takes place
   at all. The expression is just skipped. */
{
  lword saved_caddr = caddr;
  struct Expr *tree;
  int abs;

  caddr = current_addr;
  skip();
  tree = expression();
  abs = caddr==-2 ? 1 : eval_expr(tree,result);
  free_expr(tree);
  caddr = saved_caddr;
  return abs;
}